

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_attribute.h
# Opt level: O2

bool __thiscall
winmd::reader::ElemSig::EnumValue::equals_enumerator(EnumValue *this,string_view *name)

{
  bool bVar1;
  Field FVar2;
  Constant CVar3;
  __visit_result_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_build_O2_winmd_prefix_src_winmd_src_impl_winmd_reader_custom_attribute_h:49:50),_const_std::variant<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long>_&>
  constant_value;
  constant_type cStack_68;
  Constant local_50;
  Field local_40;
  variant<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::nullptr_t>
  local_30;
  
  FVar2 = EnumDefinition::get_enumerator(&this->type,name);
  local_40.super_row_base<winmd::reader::Field>.m_table =
       FVar2.super_row_base<winmd::reader::Field>.m_table;
  local_40.super_row_base<winmd::reader::Field>.m_index =
       FVar2.super_row_base<winmd::reader::Field>.m_index;
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__deduce_visit_result<std::variant<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::nullptr_t>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/oldnewthing[P]cppwinrt/build_O2/winmd-prefix/src/winmd/src/impl/winmd_reader/custom_attribute.h:49:50)_&&,_const_std::variant<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long>_&>
    ::_S_vtable._M_arr
    [*(__index_type *)
      ((long)&(this->value).
              super__Variant_base<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long>
              .
              super__Move_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long>
              .
              super__Copy_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long>
              .
              super__Move_ctor_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long>
              .
              super__Copy_ctor_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long>
              .
              super__Variant_storage_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long>
      + 8)]._M_data)(&local_30,(anon_class_1_0_00000001 *)&cStack_68,&this->value);
  CVar3 = Field::Constant(&local_40);
  local_50.super_row_base<winmd::reader::Constant>.m_table =
       CVar3.super_row_base<winmd::reader::Constant>.m_table;
  local_50.super_row_base<winmd::reader::Constant>.m_index =
       CVar3.super_row_base<winmd::reader::Constant>.m_index;
  Constant::Value(&cStack_68,&local_50);
  bVar1 = std::operator==(&cStack_68,&local_30);
  return bVar1;
}

Assistant:

bool equals_enumerator(std::string_view const& name) const
            {
                auto field = type.get_enumerator(name);
                auto constant_value = std::visit([](auto&& v) { return Constant::constant_type{ v }; }, value);
                return field.Constant().Value() == constant_value;
            }